

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::_List_iterator<State>_>::reallocateAndGrow
          (QArrayDataPointer<std::_List_iterator<State>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::_List_iterator<State>_> *old)

{
  QArrayData *pQVar1;
  long lVar2;
  _List_iterator<State> *p_Var3;
  longlong __tmp;
  long lVar4;
  _List_iterator<State> *p_Var5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QArrayDataPointer<std::_List_iterator<State>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<std::_List_iterator<State>_> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar6 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,8,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3),
                        Grow);
    this->d = (Data *)auVar6._0_8_;
    this->ptr = (_List_iterator<State> *)auVar6._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (_List_iterator<State> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    lVar2 = this->size;
    if (lVar2 != 0) {
      lVar4 = (n >> 0x3f & n) + lVar2;
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<std::_List_iterator<State>_> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if ((lVar4 != 0) && (0 < lVar4)) {
          p_Var5 = this->ptr;
          p_Var3 = p_Var5 + lVar4;
          do {
            local_38.ptr[local_38.size]._M_node = p_Var5->_M_node;
            p_Var5 = p_Var5 + 1;
            local_38.size = local_38.size + 1;
          } while (p_Var5 < p_Var3);
        }
      }
      else if ((lVar4 != 0) && (0 < lVar4)) {
        p_Var5 = this->ptr;
        p_Var3 = p_Var5 + lVar4;
        do {
          local_38.ptr[local_38.size]._M_node = p_Var5->_M_node;
          p_Var5 = p_Var5 + 1;
          local_38.size = local_38.size + 1;
        } while (p_Var5 < p_Var3);
      }
    }
    pQVar1 = &this->d->super_QArrayData;
    p_Var3 = this->ptr;
    *(undefined4 *)&this->d = local_38.d._0_4_;
    *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
    *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
    *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar1;
    local_38.ptr = p_Var3;
    local_38.size = lVar2;
    if (old != (QArrayDataPointer<std::_List_iterator<State>_> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar1;
      local_38.ptr = old->ptr;
      old->ptr = p_Var3;
      local_38.size = old->size;
      old->size = lVar2;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }